

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O2

timestamp_t
duckdb::GetInternalCValue<duckdb::timestamp_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  timestamp_t tVar2;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      tVar2 = TryCastCInternal<bool,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_TINYINT:
      tVar2 = TryCastCInternal<signed_char,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_SMALLINT:
      tVar2 = TryCastCInternal<short,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_INTEGER:
      tVar2 = TryCastCInternal<int,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_BIGINT:
      tVar2 = TryCastCInternal<long,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_UTINYINT:
      tVar2 = TryCastCInternal<unsigned_char,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_USMALLINT:
      tVar2 = TryCastCInternal<unsigned_short,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_UINTEGER:
      tVar2 = TryCastCInternal<unsigned_int,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_UBIGINT:
      tVar2 = TryCastCInternal<unsigned_long,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_FLOAT:
      tVar2 = TryCastCInternal<float,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_DOUBLE:
      tVar2 = TryCastCInternal<double,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_TIMESTAMP:
      tVar2 = TryCastCInternal<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TryCast>
                        (result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_DATE:
      tVar2 = TryCastCInternal<duckdb::date_t,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_TIME:
      tVar2 = TryCastCInternal<duckdb::dtime_t,duckdb::timestamp_t,duckdb::TryCast>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_INTERVAL:
      tVar2 = TryCastCInternal<duckdb::interval_t,duckdb::timestamp_t,duckdb::TryCast>
                        (result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_HUGEINT:
      tVar2 = TryCastCInternal<duckdb::hugeint_t,duckdb::timestamp_t,duckdb::TryCast>
                        (result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_VARCHAR:
      tVar2 = TryCastCInternal<char*,duckdb::timestamp_t,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_BLOB:
      tVar2 = TryCastCInternal<duckdb_blob,duckdb::timestamp_t,duckdb::FromCBlobCastWrapper>
                        (result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_DECIMAL:
      tVar2 = TryCastDecimalCInternal<duckdb::timestamp_t>(result,col,row);
      return (timestamp_t)tVar2.value;
    case DUCKDB_TYPE_UHUGEINT:
      tVar2 = TryCastCInternal<duckdb::uhugeint_t,duckdb::timestamp_t,duckdb::TryCast>
                        (result,col,row);
      return (timestamp_t)tVar2.value;
    }
  }
  tVar2 = FetchDefaultValue::Operation<duckdb::timestamp_t>();
  return (timestamp_t)tVar2.value;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}